

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_keyexpimp.c
# Opt level: O0

int gost_tlstree(int cipher_nid,uchar *in,uchar *out,uchar *tlsseq)

{
  int iVar1;
  uchar *key;
  ulong keylen;
  undefined8 *in_RCX;
  int in_EDI;
  uchar ko2 [32];
  uchar ko1 [32];
  uint64_t seq;
  uint64_t seed3;
  uint64_t seed2;
  uint64_t seed1;
  uint64_t c3;
  uint64_t c2;
  uint64_t c1;
  uint64_t mg_c3;
  uint64_t mg_c2;
  uint64_t mg_c1;
  uint64_t gh_c3;
  uint64_t gh_c2;
  uint64_t gh_c1;
  size_t in_stack_ffffffffffffff70;
  uchar *label;
  uchar *keyout;
  ulong local_60;
  ulong local_58;
  uchar *seed;
  size_t seed_len;
  size_t representation;
  
  representation = 0xc0ffffff;
  seed_len = 0xfeffffffff;
  seed = (uchar *)0xf0ffffffffffff;
  if (in_EDI == 0x3f7) {
    local_58 = 0xffffffff;
    local_60 = 0xf8ffffffffff;
    keyout = (uchar *)0xc0ffffffffffffff;
  }
  else {
    if (in_EDI != 0x4a6) {
      return 0;
    }
    local_58 = 0xc0ffffff;
    local_60 = 0xfeffffffff;
    keyout = (uchar *)0xf0ffffffffffff;
  }
  label = (uchar *)*in_RCX;
  local_58 = (ulong)label & local_58;
  key = (uchar *)((ulong)label & local_60);
  keylen = (ulong)label & (ulong)keyout;
  iVar1 = gost_kdftree2012_256
                    (keyout,local_58,key,keylen,label,in_stack_ffffffffffffff70,
                     (uchar *)0xf0ffffffffffff,0xfeffffffff,0xc0ffffff);
  if (((0 < iVar1) &&
      (iVar1 = gost_kdftree2012_256
                         (keyout,local_58,key,keylen,label,in_stack_ffffffffffffff70,seed,seed_len,
                          representation), 0 < iVar1)) &&
     (iVar1 = gost_kdftree2012_256
                        (keyout,local_58,key,keylen,label,in_stack_ffffffffffffff70,seed,seed_len,
                         representation), 0 < iVar1)) {
    return 1;
  }
  return 0;
}

Assistant:

int gost_tlstree(int cipher_nid, const unsigned char *in, unsigned char *out,
                 const unsigned char *tlsseq)
{
    uint64_t gh_c1 = 0x00000000FFFFFFFF, gh_c2 = 0x0000F8FFFFFFFFFF,
        gh_c3 = 0xC0FFFFFFFFFFFFFF;
    uint64_t mg_c1 = 0x00000000C0FFFFFF, mg_c2 = 0x000000FEFFFFFFFF,
        mg_c3 = 0x00F0FFFFFFFFFFFF;
    uint64_t c1, c2, c3;
    uint64_t seed1, seed2, seed3;
    uint64_t seq;
    unsigned char ko1[32], ko2[32];

    switch (cipher_nid) {
    case NID_magma_cbc:
        c1 = mg_c1;
        c2 = mg_c2;
        c3 = mg_c3;
        break;
    case NID_grasshopper_cbc:
        c1 = gh_c1;
        c2 = gh_c2;
        c3 = gh_c3;
        break;
    default:
        return 0;
    }
#ifndef L_ENDIAN
    BUF_reverse((unsigned char *)&seq, tlsseq, 8);
#else
    memcpy(&seq, tlsseq, 8);
#endif
    seed1 = seq & c1;
    seed2 = seq & c2;
    seed3 = seq & c3;

    if (gost_kdftree2012_256(ko1, 32, in, 32, (const unsigned char *)"level1", 6,
                         (const unsigned char *)&seed1, 8, 1) <= 0
			  || gost_kdftree2012_256(ko2, 32, ko1, 32, (const unsigned char *)"level2", 6,
                         (const unsigned char *)&seed2, 8, 1) <= 0
        || gost_kdftree2012_256(out, 32, ko2, 32, (const unsigned char *)"level3", 6,
                         (const unsigned char *)&seed3, 8, 1) <= 0)
			return 0;

    return 1;
}